

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

CURLcode telnet_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  TELNET *pTVar1;
  
  pTVar1 = (data->req).p.telnet;
  if (pTVar1 != (TELNET *)0x0) {
    curl_slist_free_all(pTVar1->telnet_vars);
    pTVar1->telnet_vars = (curl_slist *)0x0;
    Curl_dyn_free(&pTVar1->out);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode telnet_done(struct Curl_easy *data,
                            CURLcode status, bool premature)
{
  struct TELNET *tn = data->req.p.telnet;
  (void)status; /* unused */
  (void)premature; /* not used */

  if(!tn)
    return CURLE_OK;

  curl_slist_free_all(tn->telnet_vars);
  tn->telnet_vars = NULL;
  Curl_dyn_free(&tn->out);
  return CURLE_OK;
}